

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

int tidyDocSaveStdout(TidyDocImpl *doc)

{
  int iVar1;
  StreamOut *out_00;
  StreamOut *out;
  uint nl;
  uint outenc;
  int status;
  TidyDocImpl *doc_local;
  
  out_00 = prvTidyFileOutput(doc,(FILE *)_stdout,(int)(doc->config).value[0x3c].v,
                             (uint)(doc->config).value[0x39].v);
  iVar1 = tidyDocSaveStream(doc,out_00);
  fflush(_stdout);
  fflush(_stderr);
  (*doc->allocator->vtbl->free)(doc->allocator,out_00);
  return iVar1;
}

Assistant:

int         tidyDocSaveStdout( TidyDocImpl* doc )
{
#if !defined(NO_SETMODE_SUPPORT)
#  if defined(_WIN32) || defined(OS2_OS)
    int oldstdoutmode = -1, oldstderrmode = -1;
#  endif
#endif

    int status = 0;
    uint outenc = cfg( doc, TidyOutCharEncoding );
    uint nl = cfg( doc, TidyNewline );
    StreamOut* out = TY_(FileOutput)( doc, stdout, outenc, nl );

#if !defined(NO_SETMODE_SUPPORT)
#  if defined(_WIN32) || defined(OS2_OS)
    oldstdoutmode = setmode( fileno(stdout), _O_BINARY );
    oldstderrmode = setmode( fileno(stderr), _O_BINARY );
#  endif
#endif

    if ( 0 == status )
      status = tidyDocSaveStream( doc, out );

    fflush(stdout);
    fflush(stderr);

#if !defined(NO_SETMODE_SUPPORT)
#  if defined(_WIN32) || defined(OS2_OS)
    if ( oldstdoutmode != -1 )
        oldstdoutmode = setmode( fileno(stdout), oldstdoutmode );
    if ( oldstderrmode != -1 )
        oldstderrmode = setmode( fileno(stderr), oldstderrmode );
#  endif
#endif

    TidyDocFree( doc, out );
    return status;
}